

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

vector<restaurant_*,_std::allocator<restaurant_*>_> * __thiscall
graph::getAdjacent(vector<restaurant_*,_std::allocator<restaurant_*>_> *__return_storage_ptr__,
                  graph *this,restaurant *vertex)

{
  bool bVar1;
  mapped_type *pmVar2;
  mapped_type *__x;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  mapped_type *__x_00;
  iterator __first;
  iterator __last;
  _Self local_80;
  _Self local_78;
  int local_70;
  int local_6c;
  int key;
  int i;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> list;
  _Self local_48 [3];
  _Self local_30;
  byte local_21;
  restaurant *local_20;
  restaurant *vertex_local;
  graph *this_local;
  vector<restaurant_*,_std::allocator<restaurant_*>_> *adj;
  
  local_21 = 0;
  local_20 = vertex;
  vertex_local = (restaurant *)this;
  this_local = (graph *)__return_storage_ptr__;
  std::vector<restaurant_*,_std::allocator<restaurant_*>_>::vector(__return_storage_ptr__);
  pmVar2 = std::
           unordered_map<restaurant_*,_int,_std::hash<restaurant_*>,_std::equal_to<restaurant_*>,_std::allocator<std::pair<restaurant_*const,_int>_>_>
           ::operator[](&this->mapper,&local_20);
  local_30._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::find(&this->v,pmVar2);
  local_48[0]._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->v);
  bVar1 = std::operator==(&local_30,local_48);
  if (bVar1) {
    local_21 = 1;
    list.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    pmVar2 = std::
             unordered_map<restaurant_*,_int,_std::hash<restaurant_*>,_std::equal_to<restaurant_*>,_std::allocator<std::pair<restaurant_*const,_int>_>_>
             ::operator[](&this->mapper,&local_20);
    __x = std::
          unordered_map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          ::operator[](&this->theGraph,pmVar2);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&key,__x);
    for (local_6c = 0; uVar3 = (ulong)local_6c,
        sVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           &key), uVar3 < sVar4; local_6c = local_6c + 1) {
      pvVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&key
                          ,(long)local_6c);
      local_70 = pvVar5->first;
      local_78._M_node =
           (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::find(&this->v,&local_70);
      local_80._M_node =
           (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->v);
      bVar1 = std::operator!=(&local_78,&local_80);
      if (bVar1) {
        __x_00 = std::
                 unordered_map<int,_restaurant_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_restaurant_*>_>_>
                 ::operator[](&this->reverseMapper,&local_70);
        std::vector<restaurant_*,_std::allocator<restaurant_*>_>::push_back
                  (__return_storage_ptr__,__x_00);
      }
    }
    __first = std::vector<restaurant_*,_std::allocator<restaurant_*>_>::begin
                        (__return_storage_ptr__);
    __last = std::vector<restaurant_*,_std::allocator<restaurant_*>_>::end(__return_storage_ptr__);
    std::
    sort<__gnu_cxx::__normal_iterator<restaurant**,std::vector<restaurant*,std::allocator<restaurant*>>>>
              ((__normal_iterator<restaurant_**,_std::vector<restaurant_*,_std::allocator<restaurant_*>_>_>
                )__first._M_current,
               (__normal_iterator<restaurant_**,_std::vector<restaurant_*,_std::allocator<restaurant_*>_>_>
                )__last._M_current);
    local_21 = 1;
    list.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&key);
  }
  if ((local_21 & 1) == 0) {
    std::vector<restaurant_*,_std::allocator<restaurant_*>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<restaurant *> graph::getAdjacent(restaurant *vertex)
{
    vector<restaurant *> adj;
    if (v.find(mapper[vertex]) == v.end())
    {
        return adj;
    }
    vector<pair<int, int>> list = theGraph[mapper[vertex]];

    for (int i = 0; i < list.size(); i++)
    {
        // find vertex to add
        int key = list[i].first;
        if (v.find(key) != v.end())
        {
            adj.push_back(reverseMapper[key]);
        }
    }

    sort(adj.begin(), adj.end());
    return adj;
}